

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

UnitBoundedPolynomial<5U,_1U> *
UnitBoundedPolynomial<5U,_1U>::fit
          (Matrix<double,_1,_3,_1,_1,_3> *A,Matrix<double,_1,_3,_1,_1,_3> *B)

{
  EigenBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>_>_>
  *in_RDX;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>_> *in_RSI;
  UnitBoundedPolynomial<5U,_1U> *in_RDI;
  int k;
  UnitBoundedPolynomial<5U,_1U> *this;
  UnitBoundedPolynomial<5U,_1U> *in_stack_fffffffffffffee0;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff38;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff40;
  undefined1 local_48 [52];
  int local_14;
  
  this = in_RDI;
  for (local_14 = 0; local_14 == 0; local_14 = local_14 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)this,(Index)in_RDI);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>_>::transpose
              (in_RSI);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,1,3,1,1,3>,1,3,true>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,in_RDX);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)this,(Index)in_RDI);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_3,_true>_>::transpose
              (in_RSI);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,1,3,1,1,3>,1,3,true>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,in_RDX);
    UnitBoundedPolynomial1<5U>::fit(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    memcpy(in_RDI->_dims + local_14,local_48,0x30);
  }
  calculateLength(in_stack_fffffffffffffee0);
  return this;
}

Assistant:

UnitBoundedPolynomial<Order, Dims> UnitBoundedPolynomial<Order, Dims>::fit(Matrix<double, Dims, Poly1::RequiredValues> A, 
                                                                           Matrix<double, Dims, Poly1::RequiredValues> B)
{
    UnitBoundedPolynomial<Order, Dims> out;

    for (int k = 0; k < Dims; ++k)
    {
        out._dims[k] = Poly1::fit(A.row(k).transpose(), B.row(k).transpose());
    }

    out.calculateLength();

    return out;
}